

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.h
# Opt level: O2

void __thiscall
GrcErrorItem::GrcErrorItem
          (GrcErrorItem *this,bool fFatal,int nID,GrpLineAndFile *lnf,string *staMsg,
          GdlObject *pgdlObj)

{
  this->m_nID = nID;
  this->m_pgdlObject = pgdlObj;
  std::__cxx11::string::string((string *)&this->m_staMsg,(string *)staMsg);
  this->m_fFatal = fFatal;
  this->m_fMsgIncludesFatality = false;
  GrpLineAndFile::GrpLineAndFile(&this->m_lnf,lnf);
  return;
}

Assistant:

GrcErrorItem(bool fFatal, int nID, GrpLineAndFile & lnf, std::string staMsg, GdlObject * pgdlObj)
		:	m_nID(nID),
			m_pgdlObject(pgdlObj),
			m_staMsg(staMsg),
			m_fFatal(fFatal),
			m_fMsgIncludesFatality(false),
			m_lnf(lnf)
	{
	}